

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O1

int testEncHandler(xmlCharEncodingHandlerPtr handler,xmlChar *dec,int decSize,xmlChar *enc,
                  int encSize)

{
  int iVar1;
  xmlBufferPtr got;
  xmlBufferPtr got_00;
  int expectLen;
  int expectLen_00;
  undefined4 in_register_00000014;
  int iVar2;
  
  got = (xmlBufferPtr)xmlBufferCreate(handler,dec,CONCAT44(in_register_00000014,decSize));
  got_00 = (xmlBufferPtr)xmlBufferCreate();
  xmlBufferAdd(got,dec,0x14);
  xmlCharEncInFunc(handler,got_00,got);
  iVar1 = bufCompare(got_00,testUTF16_utf8,expectLen);
  iVar2 = 0;
  if (iVar1 != 0) {
    testEncHandler_cold_1();
    iVar2 = -1;
  }
  xmlBufferEmpty(got_00);
  xmlBufferAdd(got_00,testUTF16_utf8,0x14);
  xmlCharEncOutFunc(handler,got,got_00);
  iVar1 = bufCompare(got,dec,expectLen_00);
  if (iVar1 != 0) {
    testEncHandler_cold_2();
    iVar2 = -1;
  }
  xmlBufferFree(got_00);
  xmlBufferFree(got);
  return iVar2;
}

Assistant:

static int
testEncHandler(xmlCharEncodingHandlerPtr handler, const xmlChar *dec,
                int decSize, const xmlChar *enc, int encSize) {
    xmlBufferPtr encBuf = xmlBufferCreate();
    xmlBufferPtr decBuf = xmlBufferCreate();
    int ret = 0;

    xmlBufferAdd(encBuf, enc, encSize);
    xmlCharEncInFunc(handler, decBuf, encBuf);
    if (bufCompare(decBuf, dec, decSize) != 0) {
        fprintf(stderr, "Decoding %s failed\n", handler->name);
        ret = -1;
    }

#ifdef LIBXML_OUTPUT_ENABLED
    xmlBufferEmpty(decBuf);
    xmlBufferAdd(decBuf, dec, decSize);
    xmlCharEncOutFunc(handler, encBuf, decBuf);
    if (bufCompare(encBuf, enc, encSize) != 0) {
        fprintf(stderr, "Encoding %s failed\n", handler->name);
        ret = -1;
    }
#endif

    xmlBufferFree(decBuf);
    xmlBufferFree(encBuf);
    return(ret);
}